

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionCostCalculator.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
multi_agent_planning::InteractionCostCalculator::getInteractingAgents
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,InteractionCostCalculator *this
          ,Edge edge,int time)

{
  mapped_type *pmVar1;
  tuple<int,_multi_agent_planning::PlannedAction,_int> *i;
  pointer ptVar2;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pmVar1 = std::
           map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>_>_>
           ::at(&this->interactionMap,&edge);
  ptVar2 = (pmVar1->
           super__Vector_base<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (*(int *)((long)&(ptVar2->
                        super__Tuple_impl<0UL,_int,_multi_agent_planning::PlannedAction,_int>).
                        super__Tuple_impl<1UL,_multi_agent_planning::PlannedAction,_int>.
                        super__Head_base<1UL,_multi_agent_planning::PlannedAction,_false> + 0x28) ==
        time) {
      std::vector<int,_std::allocator<int>_>::push_back
                (__return_storage_ptr__,
                 &(ptVar2->super__Tuple_impl<0UL,_int,_multi_agent_planning::PlannedAction,_int>).
                  super__Head_base<0UL,_int,_false>._M_head_impl);
    }
    ptVar2 = ptVar2 + 1;
  } while( true );
}

Assistant:

vector<int> InteractionCostCalculator::getInteractingAgents(Edge edge, int time) const {
	vector<int> agents;

	try {
		const PlannedActionList& interactions = interactionMap.at(edge);

		for (auto const& i : interactions) {
			if (get<1>(i).start_time == time) {
				//cout << get<0>(i) << " " << get<1>(i).edge << endl;
				agents.push_back(get<0>(i));
			}
		}
	}
	catch (std::out_of_range) {
		return agents;
	}

}